

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,uchar *key,size_t keylen)

{
  int iVar1;
  mbedtls_pem_context pem;
  size_t len;
  uchar *p;
  mbedtls_pem_context local_48;
  size_t local_30;
  uchar *local_28;
  
  mbedtls_pem_init(&local_48);
  if (keylen == 0) {
    keylen = 0;
  }
  else if (((key[keylen - 1] == '\0') &&
           (iVar1 = mbedtls_pem_read_buffer
                              (&local_48,"-----BEGIN PUBLIC KEY-----","-----END PUBLIC KEY-----",key
                               ,(uchar *)0x0,0,&local_30), iVar1 != -0x1080)) &&
          (keylen = local_48.buflen, key = local_48.buf, iVar1 != 0)) goto LAB_00110f97;
  local_28 = key;
  iVar1 = mbedtls_pk_parse_subpubkey(&local_28,key + keylen,ctx);
LAB_00110f97:
  mbedtls_pem_free(&local_48);
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_public_key( mbedtls_pk_context *ctx,
                         const unsigned char *key, size_t keylen )
{
    int ret;
    unsigned char *p;
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;

    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( keylen == 0 || key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                "-----BEGIN PUBLIC KEY-----",
                "-----END PUBLIC KEY-----",
                key, NULL, 0, &len );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        key = pem.buf;
        keylen = pem.buflen;
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
#endif /* MBEDTLS_PEM_PARSE_C */
    p = (unsigned char *) key;

    ret = mbedtls_pk_parse_subpubkey( &p, p + keylen, ctx );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_free( &pem );
#endif

    return( ret );
}